

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O1

uint8_t * bstr_rstrip(uint8_t *pBegin,uint8_t *pEnd)

{
  uint8_t *pNext;
  uint8_t *puVar1;
  
  if (pEnd <= pBegin) {
    return pBegin;
  }
  do {
    puVar1 = pEnd;
    if (puVar1 <= pBegin) {
      return puVar1;
    }
    pEnd = puVar1 + -1;
  } while ((0xffffd9ffUL >> (puVar1[-1] & 0x3f) & 1) == 0 && puVar1[-1] < 0x21);
  return puVar1;
}

Assistant:

const uint8_t *bstr_while_predicate_reverse(const uint8_t *pBegin, const uint8_t *pEnd, int (*pred_func)(int c) )
{
   if (pBegin < pEnd)
   {
      const uint8_t *pNext = pEnd;
      while (pNext > pBegin)
      {
         const uint8_t *pTest = pNext-1;
         int c = (int) *pTest;
         if (!pred_func(c)){
            break;
         }
         pNext--;
      }
      return pNext;
   }
   return pBegin;
}